

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall gvr::Model::setOriginFromPLY(Model *this,PLYReader *ply)

{
  int iVar1;
  istream *piVar2;
  basic_istream<char,_std::char_traits<char>_> *in_00;
  ulong uVar3;
  long lVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  comment;
  string s;
  istringstream in;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1f8;
  double *local_1e0;
  double *local_1d8;
  undefined1 *local_1d0;
  undefined8 local_1c8;
  undefined1 local_1c0 [16];
  long local_1b0 [4];
  byte abStack_190 [88];
  ios_base local_138 [264];
  
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PLYReader::getComments(ply,&local_1f8);
  if (local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_1f8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_1d8 = (this->origin).v + 1;
    local_1e0 = (this->origin).v + 2;
    lVar4 = 0;
    uVar3 = 0;
    do {
      std::__cxx11::istringstream::istringstream
                ((istringstream *)local_1b0,
                 (string *)
                 ((long)&((local_1f8.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar4),
                 _S_in);
      local_1c8 = 0;
      local_1c0[0] = 0;
      local_1d0 = local_1c0;
      std::operator>>((istream *)local_1b0,(string *)&local_1d0);
      iVar1 = std::__cxx11::string::compare((char *)&local_1d0);
      if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)&local_1d0), iVar1 == 0)) {
        piVar2 = std::istream::_M_extract<double>((double *)local_1b0);
        piVar2 = std::istream::_M_extract<double>((double *)piVar2);
        std::istream::_M_extract<double>((double *)piVar2);
        if ((abStack_190[*(long *)(local_1b0[0] + -0x18)] & 5) != 0) {
          (this->origin).v[0] = 0.0;
          (this->origin).v[1] = 0.0;
          (this->origin).v[2] = 0.0;
        }
      }
      iVar1 = std::__cxx11::string::compare((char *)&local_1d0);
      if ((iVar1 == 0) || (iVar1 = std::__cxx11::string::compare((char *)&local_1d0), iVar1 == 0)) {
        in_00 = gmath::operator>>((basic_istream<char,_std::char_traits<char>_> *)local_1b0,
                                  &this->Rc);
        gmath::operator>>(in_00,&this->Tc);
      }
      if (local_1d0 != local_1c0) {
        operator_delete(local_1d0);
      }
      std::__cxx11::istringstream::~istringstream((istringstream *)local_1b0);
      std::ios_base::~ios_base(local_138);
      uVar3 = uVar3 + 1;
      lVar4 = lVar4 + 0x20;
    } while (uVar3 < (ulong)((long)local_1f8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_1f8.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1f8);
  return;
}

Assistant:

void Model::setOriginFromPLY(PLYReader &ply)
{
  std::vector<std::string> comment;

  ply.getComments(comment);

  for (size_t i=0; i<comment.size(); i++)
  {
    std::istringstream in(comment[i]);
    std::string s;

    in >> s;

    if (s.compare("Origin") == 0 || s.compare("origin") == 0)
    {
      in >> origin[0] >> origin[1] >> origin[2];

      if (in.fail())
      {
        origin[0]=origin[1]=origin[2]=0;
      }
    }

    if (s.compare("Camera") == 0 || s.compare("camera") == 0)
    {
      try
      {
        in >> Rc >> Tc;
      }
      catch (const gutil::Exception &)
      {
        Rc=0;
        Tc=0;
      }
    }
  }
}